

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

void tlb_flush_page_by_mmuidx_all_cpus_synced_ppc64
               (CPUState *src_cpu,target_ulong addr,uint16_t idxmap)

{
  ulong *mem;
  ulong addr_00;
  
  addr_00 = addr & 0xfffffffffffff000;
  if (idxmap < 0x1000) {
    tlb_flush_page_by_mmuidx_async_0(src_cpu,addr_00,idxmap);
    return;
  }
  mem = (ulong *)g_malloc(0x10);
  *mem = addr_00;
  *(uint16_t *)(mem + 1) = idxmap;
  tlb_flush_page_by_mmuidx_async_0(src_cpu,addr_00,idxmap);
  g_free(mem);
  return;
}

Assistant:

void tlb_flush_page_by_mmuidx_all_cpus_synced(CPUState *src_cpu,
                                              target_ulong addr,
                                              uint16_t idxmap)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = src_cpu->uc;
#endif

    /* This should already be page aligned */
    addr &= TARGET_PAGE_MASK;

    /*
     * Allocate memory to hold addr+idxmap only when needed.
     * See tlb_flush_page_by_mmuidx for details.
     */
    if (idxmap < TARGET_PAGE_SIZE) {
        flush_all_helper(src_cpu, tlb_flush_page_by_mmuidx_async_1,
                         RUN_ON_CPU_TARGET_PTR(addr | idxmap));
        tlb_flush_page_by_mmuidx_async_1(src_cpu, RUN_ON_CPU_TARGET_PTR(addr | idxmap));
    } else {
        //CPUState *dst_cpu;
        TLBFlushPageByMMUIdxData *d;

#if 0
        /* Allocate a separate data block for each destination cpu.  */
        CPU_FOREACH(dst_cpu) {
            if (dst_cpu != src_cpu) {
                d = g_new(TLBFlushPageByMMUIdxData, 1);
                d->addr = addr;
                d->idxmap = idxmap;
                tlb_flush_page_by_mmuidx_async_2(dst_cpu, RUN_ON_CPU_HOST_PTR(d));
            }
        }
#endif

        d = g_new(TLBFlushPageByMMUIdxData, 1);
        d->addr = addr;
        d->idxmap = idxmap;
        tlb_flush_page_by_mmuidx_async_2(src_cpu, RUN_ON_CPU_HOST_PTR(d));
    }
}